

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeReal(Vdbe *v,char *z,int negateFlag,int iMem)

{
  undefined4 in_EAX;
  int length;
  undefined4 in_register_00000004;
  u8 *in_R9;
  double value;
  
  if (z != (char *)0x0) {
    value = (double)CONCAT44(in_register_00000004,in_EAX);
    length = sqlite3Strlen30(z);
    sqlite3AtoF(z,&value,length,'\x01');
    if (negateFlag != 0) {
      value = -value;
    }
    sqlite3VdbeAddOp4Dup8(v,0x84,iMem,(int)&value,-0xd,in_R9,value._0_4_);
  }
  return;
}

Assistant:

static void codeReal(Vdbe *v, const char *z, int negateFlag, int iMem){
  if( ALWAYS(z!=0) ){
    double value;
    sqlite3AtoF(z, &value, sqlite3Strlen30(z), SQLITE_UTF8);
    assert( !sqlite3IsNaN(value) ); /* The new AtoF never returns NaN */
    if( negateFlag ) value = -value;
    sqlite3VdbeAddOp4Dup8(v, OP_Real, 0, iMem, 0, (u8*)&value, P4_REAL);
  }
}